

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::rr_e(CPU *this)

{
  rr_r8(this,&this->regs->e);
  return 2;
}

Assistant:

int CPU::rr_e() {
    rr_r8(regs.e);
    return 2;
}